

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O1

unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> __thiscall
duckdb::ClientContext::Query(ClientContext *this,string *query,bool allow_stream_result)

{
  StatementReturnType SVar1;
  pointer pcVar2;
  _func_int **pp_Var3;
  undefined8 uVar4;
  bool bVar5;
  type pCVar6;
  reference pvVar7;
  pointer pPVar8;
  type lock_00;
  Allocator *allocator_p;
  _Tuple_impl<0UL,_duckdb::PendingQueryResult_*,_std::default_delete<duckdb::PendingQueryResult>_>
  this_00;
  undefined4 in_ECX;
  undefined7 in_register_00000011;
  element_type *peVar9;
  ClientContext *this_01;
  size_type __n;
  bool bVar10;
  templated_unique_single_t collection;
  unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *result;
  unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true> lock;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  names;
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
  statements;
  ErrorData error;
  StatementType local_2e1;
  undefined1 local_2e0 [16];
  element_type *local_2d0;
  undefined1 local_2c8 [8];
  undefined1 local_2c0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  _Alloc_hider local_288;
  undefined1 local_274;
  undefined1 local_270 [16];
  _Alloc_hider local_260;
  char local_250 [16];
  __node_base_ptr *local_240 [2];
  __node_base_ptr local_230 [2];
  char *local_220;
  size_type local_218;
  __node_base_ptr local_210;
  size_type local_208;
  char *local_200;
  size_t sStack_1f8;
  idx_t local_1f0;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [24];
  idx_t local_1c0;
  undefined1 auStack_1b8 [16];
  __node_base_ptr local_1a8;
  __node_base local_1a0;
  idx_t iStack_198;
  float local_190;
  idx_t local_188;
  __node_base_ptr p_Stack_180;
  undefined4 local_178;
  __node_base_ptr local_170;
  bool local_168;
  undefined1 local_160 [16];
  char local_150 [32];
  undefined1 local_130 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_e8 [56];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  undefined1 local_a0 [32];
  undefined1 local_80 [24];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68 [56];
  
  local_2e0._8_8_ = this;
  _local_274 = in_ECX;
  LockContext((ClientContext *)local_2c0);
  ErrorData::ErrorData((ErrorData *)&local_b0);
  local_298._M_allocated_capacity = 0;
  local_298._8_8_ = (tuple<duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>)0x0;
  local_288._M_p = (pointer)0x0;
  pCVar6 = unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
           ::operator*((unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
                        *)local_2c0);
  bVar5 = ParseStatements((ClientContext *)query,pCVar6,
                          (string *)CONCAT71(in_register_00000011,allow_stream_result),
                          (vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                           *)&local_298,(ErrorData *)&local_b0);
  if (bVar5) {
    if (local_298._M_allocated_capacity == local_298._8_8_) {
      local_1e8._0_8_ = local_1d8 + 0x20;
      local_1e8._8_8_ = 1;
      local_1d8._0_8_ = (__buckets_ptr)0x0;
      local_1d8._8_8_ = 0;
      local_1d8._16_4_ = 1.0;
      local_1c0 = 0;
      auStack_1b8._0_8_ = (__node_base_ptr)0x0;
      auStack_1b8._8_8_ = &p_Stack_180;
      local_1a8 = (__node_base_ptr)&DAT_00000001;
      local_1a0._M_nxt = (_Hash_node_base *)0x0;
      iStack_198 = 0;
      local_190 = 1.0;
      local_188 = 0;
      p_Stack_180 = (__node_base_ptr)0x0;
      local_178._0_1_ = true;
      local_178._1_1_ = false;
      local_178._2_1_ = true;
      local_178._3_1_ = QUERY_RESULT;
      local_170 = (__node_base_ptr)0x0;
      local_168 = false;
      local_2b8.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b8.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      allocator_p = Allocator::DefaultAllocator();
      this_00.super__Head_base<0UL,_duckdb::PendingQueryResult_*,_false>._M_head_impl =
           (_Head_base<0UL,_duckdb::PendingQueryResult_*,_false>)operator_new(0x70);
      ColumnDataCollection::ColumnDataCollection
                ((ColumnDataCollection *)
                 this_00.super__Head_base<0UL,_duckdb::PendingQueryResult_*,_false>._M_head_impl,
                 allocator_p);
      local_2e1 = INVALID_STATEMENT;
      local_2e0._0_8_ =
           this_00.super__Head_base<0UL,_duckdb::PendingQueryResult_*,_false>._M_head_impl;
      GetClientProperties((ClientProperties *)local_160,(ClientContext *)query);
      make_uniq<duckdb::MaterializedQueryResult,duckdb::StatementType,duckdb::StatementProperties&,duckdb::vector<std::__cxx11::string,true>,duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>,duckdb::ClientProperties>
                ((duckdb *)&local_2d0,&local_2e1,(StatementProperties *)local_1e8,&local_2b8,
                 (unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                  *)local_2e0,(ClientProperties *)local_160);
      ((BaseQueryResult *)local_2e0._8_8_)->_vptr_BaseQueryResult = (_func_int **)local_2d0;
      local_2d0 = (element_type *)0x0;
      if ((char *)local_160._0_8_ != local_150) {
        operator_delete((void *)local_160._0_8_);
      }
      uVar4 = local_2e0._0_8_;
      if ((element_type *)local_2e0._0_8_ != (element_type *)0x0) {
        ColumnDataCollection::~ColumnDataCollection((ColumnDataCollection *)local_2e0._0_8_);
        operator_delete((void *)uVar4);
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_2b8);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)(auStack_1b8 + 8));
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_1e8);
    }
    else {
      ((BaseQueryResult *)local_2e0._8_8_)->_vptr_BaseQueryResult = (_func_int **)0x0;
      local_2b8.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      if (local_298._8_8_ != local_298._M_allocated_capacity) {
        __n = 0;
        bVar5 = false;
        local_270._0_8_ = query;
        do {
          this_01 = (ClientContext *)local_270._0_8_;
          pvVar7 = vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                   ::operator[]((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                                 *)&local_298,__n);
          __n = __n + 1;
          local_160._0_8_ = (char *)0x0;
          local_160[8] = (bool)(__n == (long)(local_298._8_8_ - local_298._0_8_) >> 3 & local_274);
          pCVar6 = unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
                   ::operator*((unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
                                *)local_2c0);
          local_2c8 = (undefined1  [8])
                      (pvVar7->
                      super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>
                      )._M_t.
                      super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>
                      .super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
          (pvVar7->
          super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)._M_t.
          super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>
          .super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = (SQLStatement *)0x0;
          PendingQueryInternal
                    ((ClientContext *)local_2e0,(ClientContextLock *)this_01,
                     (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                      *)pCVar6,(PendingQueryParameters *)local_2c8,SUB81(local_160,0));
          if (local_2c8 != (undefined1  [8])0x0) {
            (*(*(_func_int ***)local_2c8)[1])();
          }
          local_2c8 = (undefined1  [8])0x0;
          pPVar8 = unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                   ::operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                                 *)local_2e0);
          SVar1 = (pPVar8->super_BaseQueryResult).properties.return_type;
          bVar10 = SVar1 == QUERY_RESULT;
          pPVar8 = unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                   ::operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                                 *)local_2e0);
          if ((pPVar8->super_BaseQueryResult).success == false) {
            pPVar8 = unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                     ::operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                                   *)local_2e0);
            local_270[8] = (pPVar8->super_BaseQueryResult).error.initialized;
            local_270[9] = (bool)(pPVar8->super_BaseQueryResult).error.type;
            local_260._M_p = local_250;
            pcVar2 = (pPVar8->super_BaseQueryResult).error.raw_message._M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_260,pcVar2,
                       pcVar2 + (pPVar8->super_BaseQueryResult).error.raw_message._M_string_length);
            local_240[0] = local_230;
            pcVar2 = (pPVar8->super_BaseQueryResult).error.final_message._M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_240,pcVar2,
                       pcVar2 + (pPVar8->super_BaseQueryResult).error.final_message._M_string_length
                      );
            local_220 = (char *)0x0;
            local_218 = (pPVar8->super_BaseQueryResult).error.extra_info._M_h._M_bucket_count;
            local_210 = (__node_base_ptr)0x0;
            local_208 = (pPVar8->super_BaseQueryResult).error.extra_info._M_h._M_element_count;
            local_200 = *(char **)&(pPVar8->super_BaseQueryResult).error.extra_info._M_h.
                                   _M_rehash_policy;
            sStack_1f8 = (pPVar8->super_BaseQueryResult).error.extra_info._M_h._M_rehash_policy.
                         _M_next_resize;
            local_1f0 = 0;
            local_1e8._0_8_ = &local_220;
            ::std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::
            _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
                      ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)local_1e8._0_8_,&(pPVar8->super_BaseQueryResult).error.extra_info._M_h,
                       (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
                        *)local_1e8);
            local_1e8._0_8_ = local_1e8 + 0x10;
            local_1e8._8_8_ = 0;
            local_1d8._0_8_ = local_1d8._0_8_ & 0xffffffffffffff00;
            ProcessError(this_01,(ErrorData *)(local_270 + 8),(string *)local_1e8);
            make_uniq<duckdb::MaterializedQueryResult,duckdb::ErrorData>
                      ((duckdb *)&local_2d0,(ErrorData *)(local_270 + 8));
            peVar9 = local_2d0;
            local_2d0 = (element_type *)0x0;
            if ((element_type *)local_1e8._0_8_ != (element_type *)(local_1e8 + 0x10)) {
              operator_delete((void *)local_1e8._0_8_);
            }
            ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)&local_220);
            if (local_240[0] != local_230) {
              operator_delete(local_240[0]);
            }
            if (local_260._M_p != local_250) {
              operator_delete(local_260._M_p);
            }
          }
          else {
            unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
            ::operator*((unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
                         *)local_2c0);
            lock_00 = unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                      ::operator*((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                                   *)local_2e0);
            PendingQueryResult::ExecuteInternal
                      ((PendingQueryResult *)local_1e8,(ClientContextLock *)lock_00);
            peVar9 = (element_type *)local_1e8._0_8_;
          }
          if ((local_2b8.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) || (!bVar5)) {
            pp_Var3 = ((BaseQueryResult *)local_2e0._8_8_)->_vptr_BaseQueryResult;
            ((BaseQueryResult *)local_2e0._8_8_)->_vptr_BaseQueryResult = (_func_int **)peVar9;
            if (pp_Var3 != (_func_int **)0x0) {
              (**(code **)(*pp_Var3 + 8))();
            }
LAB_004cdcfe:
            local_2b8.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)peVar9;
            optional_ptr<duckdb::QueryResult,_true>::CheckValid
                      ((optional_ptr<duckdb::QueryResult,_true> *)&local_2b8);
            bVar5 = bVar10;
            if ((char)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)local_2b8.
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 0xc0))->_M_use_count ==
                '\0') {
              LOCK();
              (this_01->interrupted)._M_base._M_i = false;
              UNLOCK();
              bVar10 = true;
              peVar9 = (element_type *)0x0;
            }
            else {
              peVar9 = (element_type *)0x0;
              bVar10 = false;
            }
          }
          else {
            bVar10 = false;
            if (SVar1 == QUERY_RESULT) {
              optional_ptr<duckdb::QueryResult,_true>::CheckValid
                        ((optional_ptr<duckdb::QueryResult,_true> *)&local_2b8);
              this_01 = (ClientContext *)local_270._0_8_;
              pp_Var3 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        ((long)local_2b8.
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 0x180))->
                        _vptr__Sp_counted_base;
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              ((long)local_2b8.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 0x180))->_vptr__Sp_counted_base =
                   (_func_int **)peVar9;
              if (pp_Var3 != (_func_int **)0x0) {
                (**(code **)(*pp_Var3 + 8))();
              }
              optional_ptr<duckdb::QueryResult,_true>::CheckValid
                        ((optional_ptr<duckdb::QueryResult,_true> *)&local_2b8);
              peVar9 = (element_type *)
                       ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       ((long)local_2b8.
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 0x180))->
                       _vptr__Sp_counted_base;
              bVar10 = bVar5;
              goto LAB_004cdcfe;
            }
          }
          if (peVar9 != (element_type *)0x0) {
            (*(code *)(((peVar9->super_enable_shared_from_this<duckdb::DatabaseInstance>).
                        __weak_this_.internal.
                        super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->super_enable_shared_from_this<duckdb::DatabaseInstance>).
                      __weak_this_.internal.
                      super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)(peVar9);
          }
          if ((element_type *)local_2e0._0_8_ != (element_type *)0x0) {
            (*(code *)((__shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2> *)
                      &((weak_ptr<duckdb::ClientContext,_true> *)
                       &((BaseQueryResult *)local_2e0._0_8_)->_vptr_BaseQueryResult)->internal)->
                      _M_ptr->alloc)();
          }
        } while ((!bVar10) && (__n < (ulong)((long)(local_298._8_8_ - local_298._0_8_) >> 3)));
      }
    }
  }
  else {
    local_130._0_2_ = local_b0._M_allocated_capacity._0_2_;
    if ((__node_base_ptr)local_b0._8_8_ == (__node_base_ptr)(local_a0 + 8)) {
      local_130._32_4_ = local_a0._16_4_;
      local_130._36_4_ = local_a0._20_4_;
      local_130._8_8_ = (pointer)(local_130 + 0x18);
    }
    else {
      local_130._8_8_ = local_b0._8_8_;
    }
    local_130._16_8_ = local_a0._0_8_;
    local_a0._0_8_ = (tuple<duckdb::ClientData_*,_std::default_delete<duckdb::ClientData>_>)0x0;
    local_a0._8_4_ = local_a0._8_4_ & 0xffffff00;
    if (local_a0._24_8_ == (long)local_80 + 8) {
      uStack_f0 = local_80._16_4_;
      uStack_ec = local_80._20_4_;
      local_130._40_8_ = (MetaTransaction *)(local_100._M_local_buf + 8);
    }
    else {
      local_130._40_8_ = local_a0._24_8_;
    }
    local_100._M_allocated_capacity = local_80._0_8_;
    local_80._0_8_ = 0;
    local_80._8_4_ = local_80._8_4_ & 0xffffff00;
    local_b0._8_8_ = (__node_base_ptr)(local_a0 + 8);
    local_a0._24_8_ = (long)local_80 + 8;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Hashtable(local_e8,local_68);
    ProcessError((ClientContext *)query,(ErrorData *)local_130,
                 (string *)CONCAT71(in_register_00000011,allow_stream_result));
    make_uniq<duckdb::MaterializedQueryResult,duckdb::ErrorData>
              ((duckdb *)local_1e8,(ErrorData *)local_130);
    ((BaseQueryResult *)local_2e0._8_8_)->_vptr_BaseQueryResult = (_func_int **)local_1e8._0_8_;
    local_1e8._0_8_ = (element_type *)0x0;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(local_e8);
    if ((MetaTransaction *)local_130._40_8_ != (MetaTransaction *)(local_100._M_local_buf + 8)) {
      operator_delete((void *)local_130._40_8_);
    }
    if ((pointer)local_130._8_8_ != (pointer)(local_130 + 0x18)) {
      operator_delete((void *)local_130._8_8_);
    }
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
             *)&local_298);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(local_68);
  if ((MetaTransaction *)local_a0._24_8_ != (MetaTransaction *)(local_80 + 8)) {
    operator_delete((void *)local_a0._24_8_);
  }
  if ((__node_base_ptr)local_b0._8_8_ != (__node_base_ptr)(local_a0 + 8)) {
    operator_delete((void *)local_b0._8_8_);
  }
  ::std::unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>::
  ~unique_ptr((unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>
               *)local_2c0);
  return (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)
         (__uniq_ptr_impl<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)
         local_2e0._8_8_;
}

Assistant:

unique_ptr<QueryResult> ClientContext::Query(const string &query, bool allow_stream_result) {
	auto lock = LockContext();

	ErrorData error;
	vector<unique_ptr<SQLStatement>> statements;
	if (!ParseStatements(*lock, query, statements, error)) {
		return ErrorResult<MaterializedQueryResult>(std::move(error), query);
	}
	if (statements.empty()) {
		// no statements, return empty successful result
		StatementProperties properties;
		vector<string> names;
		auto collection = make_uniq<ColumnDataCollection>(Allocator::DefaultAllocator());
		return make_uniq<MaterializedQueryResult>(StatementType::INVALID_STATEMENT, properties, std::move(names),
		                                          std::move(collection), GetClientProperties());
	}

	unique_ptr<QueryResult> result;
	optional_ptr<QueryResult> last_result;
	bool last_had_result = false;
	for (idx_t i = 0; i < statements.size(); i++) {
		auto &statement = statements[i];
		bool is_last_statement = i + 1 == statements.size();
		PendingQueryParameters parameters;
		parameters.allow_stream_result = allow_stream_result && is_last_statement;
		auto pending_query = PendingQueryInternal(*lock, std::move(statement), parameters);
		auto has_result = pending_query->properties.return_type == StatementReturnType::QUERY_RESULT;
		unique_ptr<QueryResult> current_result;
		if (pending_query->HasError()) {
			current_result = ErrorResult<MaterializedQueryResult>(pending_query->GetErrorObject());
		} else {
			current_result = ExecutePendingQueryInternal(*lock, *pending_query);
		}
		// now append the result to the list of results
		if (!last_result || !last_had_result) {
			// first result of the query
			result = std::move(current_result);
			last_result = result.get();
			last_had_result = has_result;
		} else {
			// later results; attach to the result chain
			// but only if there is a result
			if (!has_result) {
				continue;
			}
			last_result->next = std::move(current_result);
			last_result = last_result->next.get();
		}
		D_ASSERT(last_result);
		if (last_result->HasError()) {
			// Reset the interrupted flag, this was set by the task that found the error
			// Next statements should not be bothered by that interruption
			interrupted = false;
			break;
		}
	}
	return result;
}